

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

bool __thiscall chrono::ChDirectSolverLS::SetupCurrent(ChDirectSolverLS *this)

{
  int iVar1;
  rep_conflict rVar2;
  ChLog *pCVar3;
  ChStreamOutAscii *pCVar4;
  Index IVar5;
  double dVar6;
  
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_assembly).m_start.__d.__r = rVar2;
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&this->m_mat);
  ChTimer<double>::stop(&this->m_timer_setup_assembly);
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_solvercall).m_start.__d.__r = rVar2;
  iVar1 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xc])(this);
  ChTimer<double>::stop(&this->m_timer_setup_solvercall);
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    pCVar3 = GetLog();
    pCVar4 = ChStreamOutAscii::operator<<
                       (&pCVar3->super_ChStreamOutAscii," Solver SetupCurrent() [");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,this->m_setup_call);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"] n = ");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,this->m_dim);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"  nnz = ");
    IVar5 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::nonZeros
                      (&(this->m_mat).
                        super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,(int)IVar5);
    ChStreamOutAscii::operator<<(pCVar4,"\n");
    pCVar3 = GetLog();
    pCVar4 = ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"  assembly matrix:   ");
    dVar6 = ChTimer<double>::GetTimeSecondsIntermediate(&this->m_timer_setup_assembly);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVar6);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"s\n");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"  analyze+factorize: ");
    dVar6 = ChTimer<double>::GetTimeSecondsIntermediate(&this->m_timer_setup_solvercall);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVar6);
    ChStreamOutAscii::operator<<(pCVar4,"s\n");
  }
  this->m_setup_call = this->m_setup_call + 1;
  if (SUB41(iVar1,0) == false) {
    pCVar3 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"Solver SetupCurrent() failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool ChDirectSolverLS::SetupCurrent() {
    m_timer_setup_assembly.start();

    // Allow the matrix to be compressed, if not yet compressed
    m_mat.makeCompressed();

    m_timer_setup_assembly.stop();

    // Let the concrete solver perform the factorization
    m_timer_setup_solvercall.start();
    bool result = FactorizeMatrix();
    m_timer_setup_solvercall.stop();

    if (verbose) {
        GetLog() << " Solver SetupCurrent() [" << m_setup_call << "] n = " << m_dim
                 << "  nnz = " << (int)m_mat.nonZeros() << "\n";
        GetLog() << "  assembly matrix:   " << m_timer_setup_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  analyze+factorize: " << m_timer_setup_solvercall.GetTimeSecondsIntermediate() << "s\n";
    }

    m_setup_call++;

    if (!result) {
        // If the factorization failed, let the concrete solver display an error message.
        GetLog() << "Solver SetupCurrent() failed\n";
        PrintErrorMessage();
    }

    return result;
}